

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinter.cpp
# Opt level: O3

void __thiscall QPrinterPrivate::setPreviewMode(QPrinterPrivate *this,bool enable)

{
  QPrinter *pQVar1;
  QPrinterPrivate *pQVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  byte bVar7;
  QPreviewPaintEngine *this_00;
  undefined7 in_register_00000031;
  
  pQVar1 = this->q_ptr;
  if ((int)CONCAT71(in_register_00000031,enable) != 0) {
    this_00 = this->previewEngine;
    if (this_00 == (QPreviewPaintEngine *)0x0) {
      this_00 = (QPreviewPaintEngine *)operator_new(0x28);
      QPreviewPaintEngine::QPreviewPaintEngine(this_00);
      this->previewEngine = this_00;
    }
    this->field_0x44 = this->field_0x44 & 0xfc | this->field_0x44 * '\x02' & 2U;
    uVar3 = *(undefined4 *)((long)&this->printEngine + 4);
    uVar4 = *(undefined4 *)&this->paintEngine;
    uVar5 = *(undefined4 *)((long)&this->paintEngine + 4);
    *(undefined4 *)&this->realPrintEngine = *(undefined4 *)&this->printEngine;
    *(undefined4 *)((long)&this->realPrintEngine + 4) = uVar3;
    *(undefined4 *)&this->realPaintEngine = uVar4;
    *(undefined4 *)((long)&this->realPaintEngine + 4) = uVar5;
    pQVar2 = (pQVar1->d_ptr).d;
    bVar7 = pQVar2->field_0x44;
    if (((bVar7 & 1) != 0) && (pQVar2->printEngine != (QPrintEngine *)0x0)) {
      (*pQVar2->printEngine->_vptr_QPrintEngine[1])();
      bVar7 = pQVar2->field_0x44;
    }
    pQVar2->printEngine = &this_00->super_QPrintEngine;
    pQVar2->paintEngine = &this_00->super_QPaintEngine;
    pQVar2->field_0x44 = bVar7 & 0xfe;
    QPreviewPaintEngine::setProxyEngines
              (this->previewEngine,this->realPrintEngine,this->realPaintEngine);
    return;
  }
  uVar3 = *(undefined4 *)&this->realPrintEngine;
  uVar4 = *(undefined4 *)((long)&this->realPrintEngine + 4);
  uVar5 = *(undefined4 *)&this->realPaintEngine;
  uVar6 = *(undefined4 *)((long)&this->realPaintEngine + 4);
  pQVar2 = (pQVar1->d_ptr).d;
  bVar7 = pQVar2->field_0x44;
  if (((bVar7 & 1) != 0) && (pQVar2->printEngine != (QPrintEngine *)0x0)) {
    (*pQVar2->printEngine->_vptr_QPrintEngine[1])();
    bVar7 = pQVar2->field_0x44;
  }
  *(undefined4 *)&pQVar2->printEngine = uVar3;
  *(undefined4 *)((long)&pQVar2->printEngine + 4) = uVar4;
  *(undefined4 *)&pQVar2->paintEngine = uVar5;
  *(undefined4 *)((long)&pQVar2->paintEngine + 4) = uVar6;
  pQVar2->field_0x44 = bVar7 & 0xfe;
  this->field_0x44 = this->field_0x44 & 0xfe | (byte)this->field_0x44 >> 1 & 1;
  return;
}

Assistant:

void QPrinterPrivate::setPreviewMode(bool enable)
{
    Q_Q(QPrinter);
    if (enable) {
        if (!previewEngine)
            previewEngine = new QPreviewPaintEngine;
        had_default_engines = use_default_engine;
        use_default_engine = false;
        realPrintEngine = printEngine;
        realPaintEngine = paintEngine;
        q->setEngines(previewEngine, previewEngine);
        previewEngine->setProxyEngines(realPrintEngine, realPaintEngine);
    } else {
        q->setEngines(realPrintEngine, realPaintEngine);
        use_default_engine = had_default_engines;
    }
}